

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_result ma_log_init(ma_allocation_callbacks *pAllocationCallbacks,ma_log *pLog)

{
  if (pLog != (ma_log *)0x0) {
    (pLog->allocationCallbacks).onMalloc = (_func_void_ptr_size_t_void_ptr *)0x0;
    (pLog->allocationCallbacks).onRealloc = (_func_void_ptr_void_ptr_size_t_void_ptr *)0x0;
    *(undefined8 *)&pLog->callbackCount = 0;
    (pLog->allocationCallbacks).pUserData = (void *)0x0;
    pLog->callbacks[3].onLog = (ma_log_callback_proc)0x0;
    pLog->callbacks[3].pUserData = (void *)0x0;
    pLog->callbacks[2].onLog = (ma_log_callback_proc)0x0;
    pLog->callbacks[2].pUserData = (void *)0x0;
    pLog->callbacks[1].onLog = (ma_log_callback_proc)0x0;
    pLog->callbacks[1].pUserData = (void *)0x0;
    pLog->callbacks[0].onLog = (ma_log_callback_proc)0x0;
    pLog->callbacks[0].pUserData = (void *)0x0;
    (pLog->allocationCallbacks).onFree = (_func_void_void_ptr_void_ptr *)0x0;
    ma_allocation_callbacks_init_copy(&pLog->allocationCallbacks,pAllocationCallbacks);
    return MA_SUCCESS;
  }
  return MA_INVALID_ARGS;
}

Assistant:

MA_API ma_result ma_log_init(const ma_allocation_callbacks* pAllocationCallbacks, ma_log* pLog)
{
    if (pLog == NULL) {
        return MA_INVALID_ARGS;
    }

    MA_ZERO_OBJECT(pLog);
    ma_allocation_callbacks_init_copy(&pLog->allocationCallbacks, pAllocationCallbacks);

    /* We need a mutex for thread safety. */
    #ifndef MA_NO_THREADING
    {
        ma_result result = ma_mutex_init(&pLog->lock);
        if (result != MA_SUCCESS) {
            return result;
        }
    }
    #endif

    /* If we're using debug output, enable it. */
    #if defined(MA_DEBUG_OUTPUT)
    {
        ma_log_register_callback(pLog, ma_log_callback_init(ma_log_callback_debug, NULL)); /* Doesn't really matter if this fails. */
    }
    #endif

    return MA_SUCCESS;
}